

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraUtilSupp.c
# Opt level: O0

Vec_Wrd_t * Abc_SuppGenPairs(Vec_Wrd_t *p,int nBits)

{
  ulong uVar1;
  ulong uVar2;
  int iVar3;
  Vec_Wrd_t *p_00;
  uint *p_01;
  word *pwVar4;
  int i;
  word Value;
  word *pEntry2;
  word *pEntry1;
  word *pLimit;
  uint *pMap;
  Vec_Wrd_t *vRes;
  int nBits_local;
  Vec_Wrd_t *p_local;
  
  p_00 = Vec_WrdAlloc(1000);
  iVar3 = Abc_MaxInt(0,nBits + -5);
  p_01 = (uint *)calloc((long)(1 << ((byte)iVar3 & 0x1f)),4);
  pwVar4 = Vec_WrdLimit(p);
  for (pEntry2 = Vec_WrdArray(p); Value = (word)pEntry2, pEntry2 < pwVar4; pEntry2 = pEntry2 + 1) {
    while (Value = Value + 8, Value < pwVar4) {
      uVar1 = *pEntry2;
      uVar2 = *(ulong *)Value;
      i = (int)(uVar1 ^ uVar2);
      iVar3 = Abc_InfoHasBit(p_01,i);
      if (iVar3 == 0) {
        Abc_InfoXorBit(p_01,i);
        Vec_WrdPush(p_00,uVar1 ^ uVar2);
      }
    }
  }
  if (p_01 != (uint *)0x0) {
    free(p_01);
  }
  return p_00;
}

Assistant:

Vec_Wrd_t * Abc_SuppGenPairs( Vec_Wrd_t * p, int nBits )
{
    Vec_Wrd_t * vRes = Vec_WrdAlloc( 1000 );
    unsigned * pMap = ABC_CALLOC( unsigned, 1 << Abc_MaxInt(0,nBits-5) ); 
    word * pLimit = Vec_WrdLimit(p);
    word * pEntry1 = Vec_WrdArray(p);
    word * pEntry2, Value;
    for ( ; pEntry1 < pLimit; pEntry1++ )
    for ( pEntry2 = pEntry1 + 1; pEntry2 < pLimit; pEntry2++ )
    {
        Value = *pEntry1 ^ *pEntry2;
        if ( Abc_InfoHasBit(pMap, (int)Value) )
            continue;
        Abc_InfoXorBit( pMap, (int)Value );
        Vec_WrdPush( vRes, Value );
    }
    ABC_FREE( pMap );
    return vRes;
}